

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::detail::
dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
          (detail *this,
          __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
          begin,__normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                *end,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *plist,
          Type_Conversions_State *t_conversions,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  dispatch_error *pdVar5;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar7;
  Proxy_Function_Base **t_func;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *ppVar8;
  Boxed_Value BVar9;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> newplist;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_90;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_78;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_60;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_48;
  
  ppVar6 = end->_M_current;
  t_func = &(begin._M_current)->second;
  ppVar8 = ppVar6;
  do {
    ppVar1 = (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)(t_func + -1)
    ;
    if (ppVar1 == ppVar6) {
      if (ppVar8 != ppVar6) {
        newplist.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        newplist.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        newplist.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
                  (&newplist,
                   (long)(plist->
                         super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(plist->
                         super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
        std::
        transform<__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,std::back_insert_iterator<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,chaiscript::dispatch::detail::dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>(__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>const&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&,chaiscript::Type_Conversions_State_const&,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>const&)::_lambda(chaiscript::Type_Info_const&,chaiscript::Boxed_Value_const&)_1_>
                  ((ppVar8->second->m_types).
                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1,
                   (ppVar8->second->m_types).
                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (plist->
                   super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                   )._M_impl.super__Vector_impl_data._M_start,&newplist);
        Proxy_Function_Base::operator()
                  ((Proxy_Function_Base *)this,
                   (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   ppVar8->second,(Type_Conversions_State *)&newplist);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                  (&newplist);
        BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = extraout_RDX._M_pi;
        BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)this;
        return (Boxed_Value)
               BVar9.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
      }
      pdVar5 = (dispatch_error *)__cxa_allocate_exception(0x40);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                (&local_78,plist);
      std::
      vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,void>
                ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                  *)&local_90,
                 (t_funcs->
                 super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (t_funcs->
                 super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&newplist);
      exception::dispatch_error::dispatch_error(pdVar5,&local_78,&local_90);
      __cxa_throw(pdVar5,&exception::dispatch_error::typeinfo,
                  exception::dispatch_error::~dispatch_error);
    }
    bVar4 = types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>
                      (t_func,plist,t_conversions);
    ppVar6 = end->_M_current;
    ppVar7 = ppVar8;
    if ((bVar4) && (ppVar7 = ppVar1, ppVar8 != ppVar6)) {
      uVar3 = (ppVar8->second->m_types).
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
              _M_impl.super__Vector_impl_data._M_start[1].m_flags;
      if ((*(byte *)((long)(((plist->
                             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                             )._M_impl.super__Vector_impl_data._M_start)->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 0x10) & 1) == 0) {
        if ((uVar3 & 1) != 0) goto LAB_001767cf;
        bVar2 = (byte)((*t_func)->m_types).
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_flags;
      }
      else {
        if ((uVar3 & 1) != 0) goto LAB_001767cf;
        bVar2 = (byte)((*t_func)->m_types).
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_flags;
        ppVar8 = ppVar1;
      }
      ppVar7 = ppVar8;
      if ((bVar2 & 1) == 0) {
LAB_001767cf:
        pdVar5 = (dispatch_error *)__cxa_allocate_exception(0x40);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                  (&local_48,plist);
        std::
        vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
        ::
        vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,void>
                  ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                    *)&local_60,
                   (t_funcs->
                   super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (t_funcs->
                   super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&newplist);
        exception::dispatch_error::dispatch_error(pdVar5,&local_48,&local_60);
        __cxa_throw(pdVar5,&exception::dispatch_error::typeinfo,
                    exception::dispatch_error::~dispatch_error);
      }
    }
    t_func = t_func + 2;
    ppVar8 = ppVar7;
  } while( true );
}

Assistant:

Boxed_Value dispatch_with_conversions(InItr begin, const InItr &end, const std::vector<Boxed_Value> &plist, 
            const Type_Conversions_State &t_conversions, const Funcs &t_funcs)
        {
          InItr matching_func(end);

          while (begin != end)
          {
            if (types_match_except_for_arithmetic(begin->second, plist, t_conversions))
            {
              if (matching_func == end)
              {
                matching_func = begin;
              } else {
                // handle const members vs non-const member, which is not really ambiguous
                const auto &mat_fun_param_types = matching_func->second->get_param_types();
                const auto &next_fun_param_types = begin->second->get_param_types();

                if (plist[0].is_const() && !mat_fun_param_types[1].is_const() && next_fun_param_types[1].is_const()) {
                  matching_func = begin; // keep the new one, the const/non-const matchup is correct
                } else if (!plist[0].is_const() && !mat_fun_param_types[1].is_const() && next_fun_param_types[1].is_const()) {
                  // keep the old one, it has a better const/non-const matchup
                } else {
                  // ambiguous function call
                  throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
                }
              }
            }

            ++begin;
          }

          if (matching_func == end)
          {
            // no appropriate function to attempt arithmetic type conversion on
            throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));
          }


          std::vector<Boxed_Value> newplist;
          newplist.reserve(plist.size());

          const std::vector<Type_Info> &tis = matching_func->second->get_param_types();
          std::transform(tis.begin() + 1, tis.end(),
                         plist.begin(),
                         std::back_inserter(newplist),
                         [](const Type_Info &ti, const Boxed_Value &param) -> Boxed_Value {
                           if (ti.is_arithmetic() && param.get_type_info().is_arithmetic()) {
                             return Boxed_Number(param).get_as(ti).bv;
                           } else {
                             return param;
                           }
                         }
                       );



          try {
            return (*(matching_func->second))(newplist, t_conversions);
          } catch (const exception::bad_boxed_cast &) {
            //parameter failed to cast
          } catch (const exception::arity_error &) {
            //invalid num params
          } catch (const exception::guard_error &) {
            //guard failed to allow the function to execute
          }

          throw exception::dispatch_error(plist, std::vector<Const_Proxy_Function>(t_funcs.begin(), t_funcs.end()));

        }